

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRNetServer.cpp
# Opt level: O2

void __thiscall MinVR::VRNetServer::~VRNetServer(VRNetServer *this)

{
  int *piVar1;
  string str;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (this->super_VRNetInterface)._vptr_VRNetInterface =
       (_func_int **)&PTR_syncEventDataAcrossAllNodes_0015c960;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"- ",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"VRNetServer closing all sockets.",&local_ba);
  std::operator+(&local_38,&local_58,&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"\n",&local_bb);
  std::operator+(&local_b8,&local_38,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::ostream::write((char *)&std::cout,(long)local_b8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b8);
  for (piVar1 = (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar1 < (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish; piVar1 = piVar1 + 1) {
    close(*piVar1);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

VRNetServer::~VRNetServer()
{
  VRLOG_STATUS("VRNetServer closing all sockets.");
  for (std::vector<SOCKET>::iterator i=_clientSocketFDs.begin(); i < _clientSocketFDs.end(); i++) {
	#ifdef WIN32
      closesocket(*i);
    #else
      close(*i);
    #endif
  }

#ifdef WIN32
  WSACleanup();
#endif
}